

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
google::protobuf::internal::anon_unknown_36::GenerateFieldNames
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Descriptor *descriptor,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries,
          MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields)

{
  anon_class_16_2_9057705e no_name;
  anon_class_16_2_9057705e with_name;
  unsigned_long *puVar1;
  size_type sVar2;
  byte *pbVar3;
  basic_string_view<char,_std::char_traits<char>_> str;
  string_view local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  anon_class_8_1_6534c8fa local_c8;
  anon_class_8_1_6534c8fa append;
  int local_9c;
  byte *pbStack_98;
  int count;
  uint8_t *out_it;
  allocator<unsigned_char> local_7b;
  value_type_conflict2 local_7a [2];
  size_type local_78;
  size_t total_byte_size;
  byte local_61;
  undefined1 auStack_60 [7];
  uint8_t message_name_size;
  string_view message_name;
  Descriptor **local_40;
  anon_class_8_1_247cb770 for_each_field_name;
  size_t field_name_total_size;
  MessageOptions *message_options_local;
  Descriptor *descriptor_local;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_vec;
  
  entries_local.ptr_ = (pointer)entries.len_;
  descriptor_local = (Descriptor *)entries.ptr_;
  for_each_field_name.entries =
       (Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> *)0x0;
  local_40 = &descriptor_local;
  entries_local.len_ = (size_type)__return_storage_ptr__;
  internal::(anonymous_namespace)::
  GenerateFieldNames(google::protobuf::Descriptor_const*,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_const>,google::protobuf::internal::TailCallTableInfo::MessageOptions_const&,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const>)
  ::$_1::operator()(&local_40);
  if (for_each_field_name.entries ==
      (Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  }
  else {
    _auStack_60 = Descriptor::full_name(descriptor);
    total_byte_size =
         std::basic_string_view<char,_std::char_traits<char>_>::size
                   ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
    puVar1 = std::min<unsigned_long>(&total_byte_size,&GenerateFieldNames::kMaxNameLength);
    local_61 = (byte)*puVar1;
    sVar2 = absl::lts_20250127::
            Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>::size
                      ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> *)
                       &descriptor_local);
    sVar2 = (long)&(for_each_field_name.entries)->ptr_ +
            (sVar2 + 8 & 0xfffffffffffffff8) + (ulong)local_61;
    local_7a[1] = 0;
    local_7a[0] = '\0';
    local_78 = sVar2;
    std::allocator<unsigned_char>::allocator(&local_7b);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,sVar2,local_7a,&local_7b);
    std::allocator<unsigned_char>::~allocator(&local_7b);
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (__return_storage_ptr__);
    local_9c = 1;
    pbStack_98 = pbVar3 + 1;
    *pbVar3 = local_61;
    append.out_it = &stack0xffffffffffffff68;
    with_name.count = &local_9c;
    with_name.out_it = append.out_it;
    no_name.count = &local_9c;
    no_name.out_it = append.out_it;
    internal::(anonymous_namespace)::
    GenerateFieldNames(google::protobuf::Descriptor_const*,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_const>,google::protobuf::internal::TailCallTableInfo::MessageOptions_const&,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const>)
    ::$_1::operator()(&local_40,with_name,no_name);
    pbStack_98 = pbStack_98 + (int)(-local_9c & 7);
    local_c8.out_it = &stack0xffffffffffffff68;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
    if (sVar2 < 0x100) {
      GenerateFieldNames::anon_class_8_1_6534c8fa::operator()(&local_c8,_auStack_60);
    }
    else {
      local_d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,0,0x7e);
      GenerateFieldNames::anon_class_8_1_6534c8fa::operator()(&local_c8,local_d8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"...");
      GenerateFieldNames::anon_class_8_1_6534c8fa::operator()(&local_c8,local_e8);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
      str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,sVar2 - 0x7e,
                       0xffffffffffffffff);
      GenerateFieldNames::anon_class_8_1_6534c8fa::operator()(&local_c8,str);
    }
    internal::(anonymous_namespace)::
    GenerateFieldNames(google::protobuf::Descriptor_const*,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_const>,google::protobuf::internal::TailCallTableInfo::MessageOptions_const&,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const>)
    ::$_1::operator()(&local_40,&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> GenerateFieldNames(
    const Descriptor* descriptor,
    const absl::Span<const TailCallTableInfo::FieldEntryInfo> entries,
    const TailCallTableInfo::MessageOptions& message_options,
    absl::Span<const TailCallTableInfo::FieldOptions> fields) {
  static constexpr size_t kMaxNameLength = 255;

  size_t field_name_total_size = 0;
  const auto for_each_field_name = [&](auto with_name, auto no_name) {
    for (const auto& entry : entries) {
      // We only need field names for reporting UTF-8 parsing errors, so we only
      // emit them for string fields with Utf8 transform specified.
      if (entry.utf8_check_mode != cpp::Utf8CheckMode::kNone) {
        with_name(absl::string_view(entry.field->name()));
      } else {
        no_name();
      }
    }
  };

  for_each_field_name([&](auto name) { field_name_total_size += name.size(); },
                      [] {});

  // No names needed. Omit the whole table.
  if (field_name_total_size == 0) {
    return {};
  }

  const absl::string_view message_name = descriptor->full_name();
  uint8_t message_name_size =
      static_cast<uint8_t>(std::min(message_name.size(), kMaxNameLength));
  size_t total_byte_size =
      ((/* message */ 1 + /* fields */ entries.size() + /* round up */ 7) &
       ~7) +
      message_name_size + field_name_total_size;

  std::vector<uint8_t> out_vec(total_byte_size, uint8_t{0});
  uint8_t* out_it = out_vec.data();

  // First, we output the size of each string, as an unsigned byte. The first
  // string is the message name.
  int count = 1;
  *out_it++ = message_name_size;
  for_each_field_name(
      [&](auto name) {
        *out_it++ = static_cast<uint8_t>(name.size());
        ++count;
      },
      [&] {
        ++out_it;
        ++count;
      });
  // align to an 8-byte boundary
  out_it += -count & 7;

  const auto append = [&](absl::string_view str) {
    if (!str.empty()) {
      memcpy(out_it, str.data(), str.size());
      out_it += str.size();
    }
  };

  // The message name is stored at the beginning of the string
  if (message_name.size() > kMaxNameLength) {
    static constexpr int kNameHalfLength = (kMaxNameLength - 3) / 2;
    append(message_name.substr(0, kNameHalfLength));
    append("...");
    append(message_name.substr(message_name.size() - kNameHalfLength));
  } else {
    append(message_name);
  }
  // Then we output the actual field names
  for_each_field_name([&](auto name) { append(name); }, [] {});

  return out_vec;
}